

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall Buffer_add_buffer_Test::TestBody(Buffer_add_buffer_Test *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bfy_buffer *buf_00;
  char *pcVar4;
  AssertHelper local_260;
  AssertionResult gtest_ar_4;
  string str;
  AssertHelper local_228;
  size_type expected_size;
  size_t n_expected_vecs;
  bfy_buffer buf;
  BufferWithReadonlyStrings b;
  BufferWithReadonlyStrings a;
  
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&a);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&b);
  sVar2 = anon_unknown.dwarf_1862d::buffer_count_pages(&a.buf,0xffffffffffffffff);
  sVar3 = anon_unknown.dwarf_1862d::buffer_count_pages(&b.buf,0xffffffffffffffff);
  n_expected_vecs = sVar3 + sVar2;
  expected_size = b.allstrs._M_string_length + a.allstrs._M_string_length;
  bfy_buffer_init();
  gtest_ar_4._0_8_ = (ulong)(uint)gtest_ar_4._4_4_ << 0x20;
  local_260.data_._0_4_ = bfy_buffer_add_buffer(&buf,&a.buf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&str,"0","bfy_buffer_add_buffer(&buf, &a.buf)",(int *)&gtest_ar_4,
             (int *)&local_260);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (str._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x386,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&str._M_string_length);
  gtest_ar_4._0_8_ = gtest_ar_4._0_8_ & 0xffffffff00000000;
  iVar1 = bfy_buffer_add_buffer(&buf,&b.buf);
  local_260.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&str,"0","bfy_buffer_add_buffer(&buf, &b.buf)",(int *)&gtest_ar_4,
             (int *)&local_260);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (str._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x387,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&str._M_string_length);
  gtest_ar_4._0_8_ = bfy_buffer_peek_all(&buf,(bfy_iovec *)0x0,0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&str,"n_expected_vecs","bfy_buffer_peek_all(&buf, __null, 0)",
             &n_expected_vecs,(unsigned_long *)&gtest_ar_4);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (str._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x388,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&str._M_string_length);
  gtest_ar_4._0_8_ = bfy_buffer_get_content_len(&buf);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&str,"expected_size","bfy_buffer_get_content_len(&buf)",&expected_size,
             (unsigned_long *)&gtest_ar_4);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (str._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x389,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&str._M_string_length);
  (anonymous_namespace)::buffer_remove_string_abi_cxx11_(&str,(_anonymous_namespace_ *)&buf,buf_00);
  local_260.data_ = (AssertHelperData *)str._M_string_length;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_4,"expected_size","std::size(str)",&expected_size,
             (unsigned_long *)&local_260);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_260);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x38c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_260.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_260.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  bfy_buffer_destruct(&buf);
  std::__cxx11::string::~string((string *)&str);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&b);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&a);
  return;
}

Assistant:

TEST(Buffer, add_buffer) {
    auto a = BufferWithReadonlyStrings {};
    auto b = BufferWithReadonlyStrings {};
    auto const n_expected_vecs = buffer_count_pages(&a.buf) + buffer_count_pages(&b.buf);
    auto const expected_size = std::size(a.allstrs) + std::size(b.allstrs);

    auto buf = bfy_buffer_init();
    EXPECT_EQ(0, bfy_buffer_add_buffer(&buf, &a.buf));
    EXPECT_EQ(0, bfy_buffer_add_buffer(&buf, &b.buf));
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&buf, NULL, 0));
    EXPECT_EQ(expected_size, bfy_buffer_get_content_len(&buf));

    auto const str = buffer_remove_string(&buf);
    EXPECT_EQ(expected_size, std::size(str));

    bfy_buffer_destruct(&buf);
}